

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaLoader::CreateAnimation
          (ColladaLoader *this,aiScene *pScene,ColladaParser *pParser,Animation *pSrcAnim,
          string *pName)

{
  pointer *pppaVar1;
  pointer *this_00;
  aiNode *paVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  bool bVar12;
  __type _Var13;
  reference ppaVar14;
  Node *pNVar15;
  char *pcVar16;
  const_reference __lhs;
  Accessor *pAVar17;
  Data *pDVar18;
  DeadlyImportError *this_01;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar19;
  basic_formatter *pbVar20;
  reference pvVar21;
  unsigned_long *puVar22;
  float *pfVar23;
  reference pvVar24;
  aiNodeAnim *this_02;
  aiVectorKey *paVar25;
  aiQuatKey *paVar26;
  reference pvVar27;
  Logger *pLVar28;
  reference __x;
  long lVar29;
  aiMeshMorphAnim *this_03;
  const_reference pvVar30;
  ulong *puVar31;
  key kVar32;
  reference pvVar33;
  aiAnimation *this_04;
  size_type sVar34;
  ulong uVar35;
  aiNodeAnim **ppaVar36;
  iterator __first;
  iterator __last;
  aiMeshMorphAnim **ppaVar37;
  iterator __first_00;
  iterator __last_00;
  reference ppaVar38;
  double *pdVar39;
  reference ppaVar40;
  aiMeshMorphKey *paVar41;
  ColladaLoader *pCVar42;
  ai_real aVar43;
  float extraout_XMM0_Da;
  float fVar44;
  float fVar45;
  aiMeshMorphKey *local_b20;
  aiVectorKey *local_ab8;
  aiQuatKey *local_a90;
  aiVectorKey *local_a68;
  ulong local_8c8;
  size_t a_3;
  size_t a_2;
  aiAnimation *local_898;
  aiAnimation *anim;
  uint local_888;
  uint valueIndex;
  uint key;
  uint i;
  size_type bpos;
  size_type apos;
  ChannelEntry *e_3;
  __normal_iterator<Assimp::Collada::ChannelEntry_*,_std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>_>
  local_860;
  iterator it_4;
  undefined1 local_850 [4];
  int morphAnimChannelIndex;
  vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_> morphTimeValues;
  aiMeshMorphAnim *morphAnim;
  ChannelEntry *e_2;
  __normal_iterator<Assimp::Collada::ChannelEntry_*,_std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>_>
  local_820;
  iterator it_3;
  vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
  morphChannels;
  double time_1;
  aiMatrix4x4 mat_1;
  ulong local_7b0;
  size_t a_1;
  aiNodeAnim *dstAnim;
  int local_798;
  ai_real nextSampleTime;
  int subSampleCount;
  ai_real delta;
  ai_real last_eval_angle;
  ai_real last_key_time;
  ai_real cur_key_time;
  ai_real last_key_angle;
  ai_real cur_key_angle;
  ai_real t;
  size_t pos_1;
  ChannelEntry *channelElement;
  __normal_iterator<Assimp::Collada::ChannelEntry_*,_std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>_>
  local_760;
  iterator it_2;
  ai_real nextTime;
  aiMatrix4x4 mat;
  ai_real v;
  size_t c_1;
  ai_real factor;
  ai_real preTime;
  size_t c;
  ai_real temp [16];
  unsigned_long local_6b0;
  ai_real local_6a4;
  unsigned_long uStack_6a0;
  ai_real postTime;
  size_t pos;
  ChannelEntry *e_1;
  __normal_iterator<Assimp::Collada::ChannelEntry_*,_std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>_>
  local_688;
  iterator it_1;
  undefined1 local_678 [4];
  ai_real time;
  vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_> transforms;
  vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> resultTrafos;
  ai_real local_640;
  undefined1 local_639;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  string local_4c0;
  reference local_4a0;
  ChannelEntry *e;
  __normal_iterator<Assimp::Collada::ChannelEntry_*,_std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>_>
  local_490;
  iterator it;
  ai_real endTime;
  ai_real startTime;
  size_t a;
  string local_458 [32];
  long local_438;
  size_type bracketPos;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  string local_298;
  string local_278 [32];
  string local_258 [32];
  long local_238;
  size_type dotPos;
  string local_210 [32];
  string local_1f0 [32];
  long local_1d0;
  size_type targetPos;
  size_type slashPos;
  ChannelEntry entry;
  AnimationChannel *srcChannel;
  __normal_iterator<const_Assimp::Collada::AnimationChannel_*,_std::vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>_>
  local_138;
  const_iterator cit;
  string subElement;
  string targetID;
  Node *srcNode;
  undefined1 local_d8 [8];
  string nodeName;
  vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_> entries;
  __normal_iterator<const_aiNode_**,_std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>_>
  local_98;
  __normal_iterator<const_aiNode_*const_*,_std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>_>
  local_90;
  const_iterator nit;
  vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_> morphAnims;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> anims;
  undefined1 local_48 [8];
  vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> nodes;
  string *pName_local;
  Animation *pSrcAnim_local;
  ColladaParser *pParser_local;
  aiScene *pScene_local;
  ColladaLoader *this_local;
  
  nodes.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pName;
  std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>::vector
            ((vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> *)local_48);
  CollectNodes(this,pScene->mRootNode,
               (vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> *)local_48);
  std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::vector
            ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)
             &morphAnims.super__Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>::vector
            ((vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_> *)&nit);
  local_98._M_current =
       (aiNode **)
       std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>::begin
                 ((vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> *)local_48);
  __gnu_cxx::
  __normal_iterator<aiNode_const*const*,std::vector<aiNode_const*,std::allocator<aiNode_const*>>>::
  __normal_iterator<aiNode_const**>
            ((__normal_iterator<aiNode_const*const*,std::vector<aiNode_const*,std::allocator<aiNode_const*>>>
              *)&local_90,&local_98);
LAB_0063823c:
  entries.
  super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>::end
                          ((vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> *)local_48);
  bVar12 = __gnu_cxx::operator!=
                     (&local_90,
                      (__normal_iterator<const_aiNode_**,_std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>_>
                       *)&entries.
                          super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar12) {
    bVar12 = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::empty
                       ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)
                        &morphAnims.
                         super__Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((!bVar12) ||
       (bVar12 = std::vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>::empty
                           ((vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_> *)&nit),
       !bVar12)) {
      this_04 = (aiAnimation *)operator_new(0x448);
      aiAnimation::aiAnimation(this_04);
      local_898 = this_04;
      aiString::Set((aiString *)this_04,
                    (string *)
                    nodes.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar34 = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::size
                         ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)
                          &morphAnims.
                           super__Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_898->mNumChannels = (uint)sVar34;
      if (local_898->mNumChannels != 0) {
        sVar34 = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::size
                           ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)
                            &morphAnims.
                             super__Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = sVar34;
        uVar35 = SUB168(auVar8 * ZEXT816(8),0);
        if (SUB168(auVar8 * ZEXT816(8),8) != 0) {
          uVar35 = 0xffffffffffffffff;
        }
        ppaVar36 = (aiNodeAnim **)operator_new__(uVar35);
        local_898->mChannels = ppaVar36;
        pppaVar1 = &morphAnims.
                    super__Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        __first = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::begin
                            ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)pppaVar1);
        __last = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::end
                           ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)pppaVar1);
        std::
        copy<__gnu_cxx::__normal_iterator<aiNodeAnim**,std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>>,aiNodeAnim**>
                  ((__normal_iterator<aiNodeAnim_**,_std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>_>
                    )__first._M_current,
                   (__normal_iterator<aiNodeAnim_**,_std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>_>
                    )__last._M_current,local_898->mChannels);
      }
      sVar34 = std::vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>::size
                         ((vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_> *)&nit);
      local_898->mNumMorphMeshChannels = (uint)sVar34;
      if (local_898->mNumMorphMeshChannels != 0) {
        ppaVar37 = (aiMeshMorphAnim **)operator_new__((ulong)local_898->mNumMorphMeshChannels << 3);
        local_898->mMorphMeshChannels = ppaVar37;
        __first_00 = std::vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>::begin
                               ((vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_> *)
                                &nit);
        __last_00 = std::vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>::end
                              ((vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_> *)&nit
                              );
        std::
        copy<__gnu_cxx::__normal_iterator<aiMeshMorphAnim**,std::vector<aiMeshMorphAnim*,std::allocator<aiMeshMorphAnim*>>>,aiMeshMorphAnim**>
                  ((__normal_iterator<aiMeshMorphAnim_**,_std::vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>_>
                    )__first_00._M_current,
                   (__normal_iterator<aiMeshMorphAnim_**,_std::vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>_>
                    )__last_00._M_current,local_898->mMorphMeshChannels);
      }
      local_898->mDuration = 0.0;
      for (a_3 = 0; sVar34 = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::size
                                       ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)
                                        &morphAnims.
                                         super__Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage),
          a_3 < sVar34; a_3 = a_3 + 1) {
        pdVar39 = &local_898->mDuration;
        pppaVar1 = &morphAnims.
                    super__Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        ppaVar38 = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::operator[]
                             ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)pppaVar1,a_3);
        paVar25 = (*ppaVar38)->mPositionKeys;
        ppaVar38 = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::operator[]
                             ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)pppaVar1,a_3);
        pdVar39 = std::max<double>(pdVar39,&paVar25[(*ppaVar38)->mNumPositionKeys - 1].mTime);
        local_898->mDuration = *pdVar39;
        pdVar39 = &local_898->mDuration;
        pppaVar1 = &morphAnims.
                    super__Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        ppaVar38 = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::operator[]
                             ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)pppaVar1,a_3);
        paVar26 = (*ppaVar38)->mRotationKeys;
        ppaVar38 = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::operator[]
                             ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)pppaVar1,a_3);
        pdVar39 = std::max<double>(pdVar39,&paVar26[(*ppaVar38)->mNumRotationKeys - 1].mTime);
        local_898->mDuration = *pdVar39;
        pdVar39 = &local_898->mDuration;
        pppaVar1 = &morphAnims.
                    super__Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        ppaVar38 = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::operator[]
                             ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)pppaVar1,a_3);
        paVar25 = (*ppaVar38)->mScalingKeys;
        ppaVar38 = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::operator[]
                             ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)pppaVar1,a_3);
        pdVar39 = std::max<double>(pdVar39,&paVar25[(*ppaVar38)->mNumScalingKeys - 1].mTime);
        local_898->mDuration = *pdVar39;
      }
      for (local_8c8 = 0;
          sVar34 = std::vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>::size
                             ((vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_> *)&nit)
          , local_8c8 < sVar34; local_8c8 = local_8c8 + 1) {
        pdVar39 = &local_898->mDuration;
        ppaVar40 = std::vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>::operator[]
                             ((vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_> *)&nit,
                              local_8c8);
        paVar41 = (*ppaVar40)->mKeys;
        ppaVar40 = std::vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>::operator[]
                             ((vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_> *)&nit,
                              local_8c8);
        pdVar39 = std::max<double>(pdVar39,&paVar41[(*ppaVar40)->mNumKeys - 1].mTime);
        local_898->mDuration = *pdVar39;
      }
      local_898->mTicksPerSecond = 1.0;
      std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::push_back
                (&this->mAnims,&local_898);
    }
    std::vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>::~vector
              ((vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_> *)&nit);
    std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::~vector
              ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)
               &morphAnims.super__Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>::~vector
              ((vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> *)local_48);
    return;
  }
  std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::vector
            ((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
              *)((long)&nodeName.field_2 + 8));
  ppaVar14 = __gnu_cxx::
             __normal_iterator<const_aiNode_*const_*,_std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>_>
             ::operator*(&local_90);
  paVar2 = *ppaVar14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_d8,(paVar2->mName).data,(allocator *)((long)&srcNode + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&srcNode + 7));
  pNVar15 = FindNode(this,pParser->mRootNode,(string *)local_d8);
  if (pNVar15 != (Node *)0x0) {
    std::__cxx11::string::string((string *)(subElement.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&cit);
    local_138._M_current =
         (AnimationChannel *)
         std::
         vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
         ::begin(&pSrcAnim->mChannels);
    while( true ) {
      srcChannel = (AnimationChannel *)
                   std::
                   vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
                   ::end(&pSrcAnim->mChannels);
      bVar12 = __gnu_cxx::operator!=
                         (&local_138,
                          (__normal_iterator<const_Assimp::Collada::AnimationChannel_*,_std::vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>_>
                           *)&srcChannel);
      if (!bVar12) break;
      entry.mValueData =
           (Data *)__gnu_cxx::
                   __normal_iterator<const_Assimp::Collada::AnimationChannel_*,_std::vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>_>
                   ::operator*(&local_138);
      Collada::ChannelEntry::ChannelEntry((ChannelEntry *)&slashPos);
      targetPos = std::__cxx11::string::find((char)entry.mValueData,0x2f);
      if (targetPos == 0xffffffffffffffff) {
        local_1d0 = std::__cxx11::string::find((string *)entry.mValueData,(ulong)&pNVar15->mID);
        if (local_1d0 != -1) {
          slashPos = (size_type)
                     __gnu_cxx::
                     __normal_iterator<const_Assimp::Collada::AnimationChannel_*,_std::vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>_>
                     ::operator*(&local_138);
          pDVar18 = entry.mValueData;
          std::__cxx11::string::length();
          std::__cxx11::string::length();
          std::__cxx11::string::length();
          std::__cxx11::string::substr((ulong)local_1f0,(ulong)pDVar18);
          std::__cxx11::string::operator=((string *)&entry,local_1f0);
          std::__cxx11::string::~string(local_1f0);
          pcVar16 = (char *)std::__cxx11::string::front();
          if (*pcVar16 == '-') {
            std::__cxx11::string::substr((ulong)local_210,(ulong)&entry);
            std::__cxx11::string::operator=((string *)&entry,local_210);
            std::__cxx11::string::~string(local_210);
          }
          std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
          ::push_back((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                       *)((long)&nodeName.field_2 + 8),(value_type *)&slashPos);
        }
      }
      else {
        lVar29 = std::__cxx11::string::find((char)entry.mValueData,0x2f);
        if (lVar29 == -1) {
          std::__cxx11::string::clear();
          std::__cxx11::string::substr((ulong)&dotPos,(ulong)entry.mValueData);
          std::__cxx11::string::operator=
                    ((string *)(subElement.field_2._M_local_buf + 8),(string *)&dotPos);
          std::__cxx11::string::~string((string *)&dotPos);
          bVar12 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&subElement.field_2 + 8),&pNVar15->mID);
          if (!bVar12) {
            local_238 = std::__cxx11::string::find((char)entry.mValueData,0x2e);
            if (local_238 == -1) {
              std::__cxx11::string::substr((ulong)&bracketPos,(ulong)entry.mValueData);
              std::__cxx11::string::operator=
                        ((string *)(entry.mTargetId.field_2._M_local_buf + 8),(string *)&bracketPos)
              ;
              std::__cxx11::string::~string((string *)&bracketPos);
            }
            else {
              lVar29 = std::__cxx11::string::find((char)entry.mValueData,0x2e);
              if (lVar29 != -1) goto LAB_00638ee8;
              std::__cxx11::string::substr((ulong)local_258,(ulong)entry.mValueData);
              std::__cxx11::string::operator=
                        ((string *)(entry.mTargetId.field_2._M_local_buf + 8),local_258);
              std::__cxx11::string::~string(local_258);
              std::__cxx11::string::clear();
              std::__cxx11::string::substr((ulong)local_278,(ulong)entry.mValueData);
              std::__cxx11::string::operator=((string *)&cit,local_278);
              std::__cxx11::string::~string(local_278);
              bVar12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&cit,"ANGLE");
              if (bVar12) {
                entry.mTransformIndex = 3;
              }
              else {
                bVar12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&cit,"X");
                if (bVar12) {
                  entry.mTransformIndex = 0;
                }
                else {
                  bVar12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&cit,"Y");
                  if (bVar12) {
                    entry.mTransformIndex = 1;
                  }
                  else {
                    bVar12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&cit,"Z");
                    if (bVar12) {
                      entry.mTransformIndex = 2;
                    }
                    else {
                      pLVar28 = DefaultLogger::get();
                      Formatter::
                      basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                      basic_formatter<char[26]>
                                (&local_410,(char (*) [26])"Unknown anim subelement <");
                      pbVar19 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *
                                )Formatter::
                                 basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                                 operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                            *)&local_410,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&cit);
                      pbVar20 = (basic_formatter *)
                                Formatter::
                                basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                                operator_(pbVar19,(char (*) [12])">. Ignoring");
                      Formatter::basic_formatter::operator_cast_to_string(&local_298,pbVar20);
                      Logger::warn(pLVar28,&local_298);
                      std::__cxx11::string::~string((string *)&local_298);
                      Formatter::
                      basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                      ~basic_formatter(&local_410);
                    }
                  }
                }
              }
            }
            local_438 = std::__cxx11::string::find((char)entry.mValueData,0x28);
            if (local_438 != -1) {
              std::__cxx11::string::substr((ulong)local_458,(ulong)entry.mValueData);
              std::__cxx11::string::operator=
                        ((string *)(entry.mTargetId.field_2._M_local_buf + 8),local_458);
              std::__cxx11::string::~string(local_458);
              std::__cxx11::string::clear();
              std::__cxx11::string::substr((ulong)&a,(ulong)entry.mValueData);
              std::__cxx11::string::operator=((string *)&cit,(string *)&a);
              std::__cxx11::string::~string((string *)&a);
              bVar12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&cit,"(0)(0)");
              if (bVar12) {
                entry.mTransformIndex = 0;
              }
              else {
                bVar12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&cit,"(1)(0)");
                if (bVar12) {
                  entry.mTransformIndex = 1;
                }
                else {
                  bVar12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&cit,"(2)(0)");
                  if (bVar12) {
                    entry.mTransformIndex = 2;
                  }
                  else {
                    bVar12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&cit,"(3)(0)");
                    if (bVar12) {
                      entry.mTransformIndex = 3;
                    }
                    else {
                      bVar12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&cit,"(0)(1)");
                      if (bVar12) {
                        entry.mTransformIndex = 4;
                      }
                      else {
                        bVar12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&cit,"(1)(1)");
                        if (bVar12) {
                          entry.mTransformIndex = 5;
                        }
                        else {
                          bVar12 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&cit,"(2)(1)");
                          if (bVar12) {
                            entry.mTransformIndex = 6;
                          }
                          else {
                            bVar12 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&cit,"(3)(1)");
                            if (bVar12) {
                              entry.mTransformIndex = 7;
                            }
                            else {
                              bVar12 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&cit,"(0)(2)");
                              if (bVar12) {
                                entry.mTransformIndex = 8;
                              }
                              else {
                                bVar12 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&cit,"(1)(2)");
                                if (bVar12) {
                                  entry.mTransformIndex = 9;
                                }
                                else {
                                  bVar12 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&cit,"(2)(2)");
                                  if (bVar12) {
                                    entry.mTransformIndex = 10;
                                  }
                                  else {
                                    bVar12 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&cit,"(3)(2)");
                                    if (bVar12) {
                                      entry.mTransformIndex = 0xb;
                                    }
                                    else {
                                      bVar12 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&cit,"(0)(3)");
                                      if (bVar12) {
                                        entry.mTransformIndex = 0xc;
                                      }
                                      else {
                                        bVar12 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&cit,"(1)(3)");
                                        if (bVar12) {
                                          entry.mTransformIndex = 0xd;
                                        }
                                        else {
                                          bVar12 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&cit,"(2)(3)");
                                          if (bVar12) {
                                            entry.mTransformIndex = 0xe;
                                          }
                                          else {
                                            bVar12 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&cit,"(3)(3)");
                                            if (bVar12) {
                                              entry.mTransformIndex = 0xf;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            entry.mTransformId.field_2._8_8_ = 0xffffffffffffffff;
            for (_endTime = 0;
                sVar34 = std::
                         vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                         ::size(&pNVar15->mTransforms), _endTime < sVar34; _endTime = _endTime + 1)
            {
              __lhs = std::
                      vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                      ::operator[](&pNVar15->mTransforms,_endTime);
              _Var13 = std::operator==(&__lhs->mID,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)((long)&entry.mTargetId.field_2 + 8));
              if (_Var13) {
                entry.mTransformId.field_2._8_8_ = _endTime;
              }
            }
            if (entry.mTransformId.field_2._8_8_ == -1) {
              lVar29 = std::__cxx11::string::find(entry.mTargetId.field_2._M_local_buf + 8,0xb64795)
              ;
              if (lVar29 == -1) goto LAB_00638ee8;
              std::__cxx11::string::operator=
                        ((string *)&entry,(string *)(entry.mTargetId.field_2._M_local_buf + 8));
              std::__cxx11::string::operator=
                        ((string *)(entry.mTargetId.field_2._M_local_buf + 8),"");
            }
            slashPos = (size_type)
                       __gnu_cxx::
                       __normal_iterator<const_Assimp::Collada::AnimationChannel_*,_std::vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>_>
                       ::operator*(&local_138);
            std::
            vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
            push_back((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                       *)((long)&nodeName.field_2 + 8),(value_type *)&slashPos);
          }
        }
      }
LAB_00638ee8:
      Collada::ChannelEntry::~ChannelEntry((ChannelEntry *)&slashPos);
      __gnu_cxx::
      __normal_iterator<const_Assimp::Collada::AnimationChannel_*,_std::vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>_>
      ::operator++(&local_138);
    }
    bVar12 = std::
             vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
             empty((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                    *)((long)&nodeName.field_2 + 8));
    if (!bVar12) {
      it._M_current._4_4_ = 1e+20;
      it._M_current._0_4_ = -1e+20;
      local_490._M_current =
           (ChannelEntry *)
           std::
           vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
           begin((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                  *)((long)&nodeName.field_2 + 8));
      while( true ) {
        e = (ChannelEntry *)
            std::
            vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
            end((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                 *)((long)&nodeName.field_2 + 8));
        bVar12 = __gnu_cxx::operator!=
                           (&local_490,
                            (__normal_iterator<Assimp::Collada::ChannelEntry_*,_std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>_>
                             *)&e);
        if (!bVar12) break;
        local_4a0 = __gnu_cxx::
                    __normal_iterator<Assimp::Collada::ChannelEntry_*,_std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>_>
                    ::operator*(&local_490);
        pAVar17 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                            (pParser,&pParser->mAccessorLibrary,&local_4a0->mChannel->mSourceTimes);
        local_4a0->mTimeAccessor = pAVar17;
        pDVar18 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                            (pParser,&pParser->mDataLibrary,&local_4a0->mTimeAccessor->mSource);
        local_4a0->mTimeData = pDVar18;
        pAVar17 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                            (pParser,&pParser->mAccessorLibrary,&local_4a0->mChannel->mSourceValues)
        ;
        local_4a0->mValueAccessor = pAVar17;
        pDVar18 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                            (pParser,&pParser->mDataLibrary,&local_4a0->mValueAccessor->mSource);
        local_4a0->mValueData = pDVar18;
        if (local_4a0->mTimeAccessor->mCount != local_4a0->mValueAccessor->mCount) {
          local_639 = 1;
          this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter(&local_638);
          pbVar19 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                               &local_638,
                               (char (*) [57])
                               "Time count / value count mismatch in animation channel \"");
          pbVar19 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator<<(pbVar19,&local_4a0->mChannel->mTarget);
          pbVar20 = (basic_formatter *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator<<(pbVar19,(char (*) [3])0xb64072);
          Formatter::basic_formatter::operator_cast_to_string(&local_4c0,pbVar20);
          DeadlyImportError::DeadlyImportError(this_01,&local_4c0);
          local_639 = 0;
          __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        if (local_4a0->mTimeAccessor->mCount != 0) {
          local_640 = ReadFloat(this,local_4a0->mTimeAccessor,local_4a0->mTimeData,0,0);
          pfVar23 = std::min<float>((float *)((long)&it._M_current + 4),&local_640);
          it._M_current._4_4_ = *pfVar23;
          resultTrafos.
          super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               ReadFloat(this,local_4a0->mTimeAccessor,local_4a0->mTimeData,
                         local_4a0->mTimeAccessor->mCount - 1,0);
          pfVar23 = std::max<float>((float *)&it,
                                    (float *)((long)&resultTrafos.
                                                                                                          
                                                  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4));
          it._M_current._0_4_ = *pfVar23;
        }
        __gnu_cxx::
        __normal_iterator<Assimp::Collada::ChannelEntry_*,_std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>_>
        ::operator++(&local_490);
      }
      std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::vector
                ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)
                 &transforms.
                  super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar12 = std::
               vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ::empty((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                        *)((long)&nodeName.field_2 + 8));
      if ((!bVar12) &&
         (pvVar21 = std::
                    vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                    ::front((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                             *)((long)&nodeName.field_2 + 8)), pvVar21->mTimeAccessor->mCount != 0))
      {
        std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>::vector
                  ((vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                    *)local_678,&pNVar15->mTransforms);
        it_1._M_current._4_4_ = it._M_current._4_4_;
        do {
          local_688._M_current =
               (ChannelEntry *)
               std::
               vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ::begin((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                        *)((long)&nodeName.field_2 + 8));
          while( true ) {
            e_1 = (ChannelEntry *)
                  std::
                  vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                  ::end((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                         *)((long)&nodeName.field_2 + 8));
            bVar12 = __gnu_cxx::operator!=
                               (&local_688,
                                (__normal_iterator<Assimp::Collada::ChannelEntry_*,_std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>_>
                                 *)&e_1);
            if (!bVar12) break;
            pos = (size_t)__gnu_cxx::
                          __normal_iterator<Assimp::Collada::ChannelEntry_*,_std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>_>
                          ::operator*(&local_688);
            uStack_6a0 = 0;
            local_6a4 = 0.0;
            while ((uStack_6a0 < **(ulong **)(pos + 0x58) &&
                   (local_6a4 = ReadFloat(this,*(Accessor **)(pos + 0x58),*(Data **)(pos + 0x60),
                                          uStack_6a0,0), local_6a4 < it_1._M_current._4_4_))) {
              uStack_6a0 = uStack_6a0 + 1;
            }
            local_6b0 = **(long **)(pos + 0x58) - 1;
            puVar22 = std::min<unsigned_long>(&stack0xfffffffffffff960,&local_6b0);
            uStack_6a0 = *puVar22;
            for (_factor = 0; _factor < *(ulong *)(*(long *)(pos + 0x68) + 8); _factor = _factor + 1
                ) {
              aVar43 = ReadFloat(this,*(Accessor **)(pos + 0x68),*(Data **)(pos + 0x70),uStack_6a0,
                                 _factor);
              temp[_factor - 2] = aVar43;
            }
            if ((it_1._M_current._4_4_ < local_6a4) && (uStack_6a0 != 0)) {
              aVar43 = ReadFloat(this,*(Accessor **)(pos + 0x58),*(Data **)(pos + 0x60),
                                 uStack_6a0 - 1,0);
              fVar44 = it_1._M_current._4_4_ - local_6a4;
              fVar45 = aVar43 - local_6a4;
              for (stack0xfffffffffffff8f0 = 0;
                  stack0xfffffffffffff8f0 < *(ulong *)(*(long *)(pos + 0x68) + 8);
                  register0x00000000 = stack0xfffffffffffff8f0 + 1) {
                aVar43 = ReadFloat(this,*(Accessor **)(pos + 0x68),*(Data **)(pos + 0x70),
                                   uStack_6a0 - 1,stack0xfffffffffffff8f0);
                temp[stack0xfffffffffffff8f0 - 2] =
                     (aVar43 - temp[stack0xfffffffffffff8f0 - 2]) * (fVar44 / fVar45) +
                     temp[stack0xfffffffffffff8f0 - 2];
              }
            }
            lVar29 = *(long *)(*(long *)(pos + 0x68) + 8);
            pvVar24 = std::
                      vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                      ::operator[]((vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                                    *)local_678,*(size_type *)(pos + 0x48));
            std::copy<float*,float*>
                      ((float *)&c,temp + lVar29 + -2,pvVar24->f + *(long *)(pos + 0x50));
            __gnu_cxx::
            __normal_iterator<Assimp::Collada::ChannelEntry_*,_std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>_>
            ::operator++(&local_688);
          }
          ColladaParser::CalculateResultTransform
                    ((aiMatrix4x4 *)((long)&it_2._M_current + 4),pParser,
                     (vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                      *)local_678);
          std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::push_back
                    ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)
                     &transforms.
                      super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (value_type *)((long)&it_2._M_current + 4));
          it_2._M_current._0_4_ = 1e+20;
          local_760._M_current =
               (ChannelEntry *)
               std::
               vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ::begin((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                        *)((long)&nodeName.field_2 + 8));
          while( true ) {
            channelElement =
                 (ChannelEntry *)
                 std::
                 vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                 ::end((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                        *)((long)&nodeName.field_2 + 8));
            bVar12 = __gnu_cxx::operator!=
                               (&local_760,
                                (__normal_iterator<Assimp::Collada::ChannelEntry_*,_std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>_>
                                 *)&channelElement);
            if (!bVar12) break;
            pos_1 = (size_t)__gnu_cxx::
                            __normal_iterator<Assimp::Collada::ChannelEntry_*,_std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>_>
                            ::operator*(&local_760);
            for (_cur_key_angle = 0; _cur_key_angle < **(ulong **)(pos_1 + 0x58);
                _cur_key_angle = _cur_key_angle + 1) {
              last_key_angle =
                   ReadFloat(this,*(Accessor **)(pos_1 + 0x58),*(Data **)(pos_1 + 0x60),
                             _cur_key_angle,0);
              if (it_1._M_current._4_4_ < last_key_angle) {
                pfVar23 = std::min<float>((float *)&it_2,&last_key_angle);
                it_2._M_current._0_4_ = *pfVar23;
                break;
              }
            }
            pvVar24 = std::
                      vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                      ::operator[]((vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                                    *)local_678,*(size_type *)(pos_1 + 0x48));
            if ((((pvVar24->mType == TF_ROTATE) && (*(long *)(pos_1 + 0x50) == 3)) &&
                (_cur_key_angle != 0)) && (_cur_key_angle < **(ulong **)(pos_1 + 0x58))) {
              cur_key_time = ReadFloat(this,*(Accessor **)(pos_1 + 0x68),*(Data **)(pos_1 + 0x70),
                                       _cur_key_angle,0);
              last_key_time =
                   ReadFloat(this,*(Accessor **)(pos_1 + 0x68),*(Data **)(pos_1 + 0x70),
                             _cur_key_angle - 1,0);
              last_eval_angle =
                   ReadFloat(this,*(Accessor **)(pos_1 + 0x58),*(Data **)(pos_1 + 0x60),
                             _cur_key_angle,0);
              pCVar42 = this;
              delta = ReadFloat(this,*(Accessor **)(pos_1 + 0x58),*(Data **)(pos_1 + 0x60),
                                _cur_key_angle - 1,0);
              subSampleCount =
                   (int)(last_key_time +
                        ((cur_key_time - last_key_time) * (it_1._M_current._4_4_ - delta)) /
                        (last_eval_angle - delta));
              std::abs((int)pCVar42);
              if (180.0 <= extraout_XMM0_Da) {
                dVar9 = floor((double)extraout_XMM0_Da / 90.0);
                local_798 = (int)dVar9;
                if ((last_eval_angle != it_1._M_current._4_4_) ||
                   (NAN(last_eval_angle) || NAN(it_1._M_current._4_4_))) {
                  dstAnim._4_4_ =
                       it_1._M_current._4_4_ +
                       (last_eval_angle - it_1._M_current._4_4_) / (float)local_798;
                  pfVar23 = std::min<float>((float *)&it_2,(float *)((long)&dstAnim + 4));
                  it_2._M_current._0_4_ = *pfVar23;
                }
              }
            }
            __gnu_cxx::
            __normal_iterator<Assimp::Collada::ChannelEntry_*,_std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>_>
            ::operator++(&local_760);
          }
          if (1e+19 < it_2._M_current._0_4_) goto LAB_00639b3f;
          it_1._M_current._4_4_ = it_2._M_current._0_4_;
        } while( true );
      }
      goto LAB_00639b4b;
    }
    goto LAB_0063a618;
  }
  goto LAB_0063a630;
LAB_00639b3f:
  std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>::~vector
            ((vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_> *)
             local_678);
LAB_00639b4b:
  bVar12 = std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::empty
                     ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)
                      &transforms.
                       super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar12) {
    pLVar28 = DefaultLogger::get();
    Logger::warn(pLVar28,
                 "Collada loader: found empty animation channel, ignored. Please check your exporter."
                );
  }
  else {
    this_02 = (aiNodeAnim *)operator_new(0x438);
    aiNodeAnim::aiNodeAnim(this_02);
    a_1 = (size_t)this_02;
    aiString::operator=((aiString *)this_02,(string *)local_d8);
    this_00 = &transforms.
               super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    sVar34 = std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::size
                       ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)
                        this_00);
    *(int *)(a_1 + 0x404) = (int)sVar34;
    sVar34 = std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::size
                       ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)
                        this_00);
    *(int *)(a_1 + 0x410) = (int)sVar34;
    sVar34 = std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::size
                       ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)
                        this_00);
    *(int *)(a_1 + 0x420) = (int)sVar34;
    sVar34 = std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::size
                       ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)
                        this_00);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = sVar34;
    uVar35 = SUB168(auVar3 * ZEXT816(0x18),0);
    if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
      uVar35 = 0xffffffffffffffff;
    }
    paVar25 = (aiVectorKey *)operator_new__(uVar35);
    if (sVar34 != 0) {
      local_a68 = paVar25;
      do {
        aiVectorKey::aiVectorKey(local_a68);
        local_a68 = local_a68 + 1;
      } while (local_a68 != paVar25 + sVar34);
    }
    *(aiVectorKey **)(a_1 + 0x408) = paVar25;
    sVar34 = std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::size
                       ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)
                        &transforms.
                         super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = sVar34;
    uVar35 = SUB168(auVar4 * ZEXT816(0x18),0);
    if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
      uVar35 = 0xffffffffffffffff;
    }
    paVar26 = (aiQuatKey *)operator_new__(uVar35);
    if (sVar34 != 0) {
      local_a90 = paVar26;
      do {
        aiQuatKey::aiQuatKey(local_a90);
        local_a90 = local_a90 + 1;
      } while (local_a90 != paVar26 + sVar34);
    }
    *(aiQuatKey **)(a_1 + 0x418) = paVar26;
    sVar34 = std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::size
                       ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)
                        &transforms.
                         super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = sVar34;
    uVar35 = SUB168(auVar5 * ZEXT816(0x18),0);
    if (SUB168(auVar5 * ZEXT816(0x18),8) != 0) {
      uVar35 = 0xffffffffffffffff;
    }
    paVar25 = (aiVectorKey *)operator_new__(uVar35);
    if (sVar34 != 0) {
      local_ab8 = paVar25;
      do {
        aiVectorKey::aiVectorKey(local_ab8);
        local_ab8 = local_ab8 + 1;
      } while (local_ab8 != paVar25 + sVar34);
    }
    *(aiVectorKey **)(a_1 + 0x428) = paVar25;
    for (local_7b0 = 0;
        sVar34 = std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::size
                           ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)
                            &transforms.
                             super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage), local_7b0 < sVar34
        ; local_7b0 = local_7b0 + 1) {
      pvVar27 = std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::operator[]
                          ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)
                           &transforms.
                            super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,local_7b0);
      time_1 = *(double *)pvVar27;
      mat_1.a1 = pvVar27->a3;
      mat_1.a2 = pvVar27->a4;
      mat_1.a3 = pvVar27->b1;
      mat_1.a4 = pvVar27->b2;
      mat_1.b1 = pvVar27->b3;
      mat_1.b2 = pvVar27->b4;
      mat_1.b3 = pvVar27->c1;
      mat_1.b4 = pvVar27->c2;
      mat_1.c1 = pvVar27->c3;
      mat_1.c2 = pvVar27->c4;
      mat_1.c3 = pvVar27->d1;
      mat_1.c4 = pvVar27->d2;
      uVar10 = pvVar27->d3;
      uVar11 = pvVar27->d4;
      dVar9 = (double)(float)uVar11;
      mat_1.d2 = 1.0;
      mat_1.d1 = (float)uVar10;
      *(double *)(*(long *)(a_1 + 0x408) + local_7b0 * 0x18) = dVar9;
      *(double *)(*(long *)(a_1 + 0x418) + local_7b0 * 0x18) = dVar9;
      *(double *)(*(long *)(a_1 + 0x428) + local_7b0 * 0x18) = dVar9;
      lVar29 = local_7b0 * 0x18;
      aiMatrix4x4t<float>::Decompose
                ((aiMatrix4x4t<float> *)&time_1,
                 (aiVector3t<float> *)(*(long *)(a_1 + 0x428) + 8 + lVar29),
                 (aiQuaterniont<float> *)(*(long *)(a_1 + 0x418) + 8 + lVar29),
                 (aiVector3t<float> *)(*(long *)(a_1 + 0x408) + 8 + lVar29));
    }
    std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back
              ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)
               &morphAnims.super__Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&a_1);
  }
  bVar12 = std::
           vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
           empty((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                  *)((long)&nodeName.field_2 + 8));
  if ((!bVar12) &&
     (pvVar21 = std::
                vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                ::front((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                         *)((long)&nodeName.field_2 + 8)), pvVar21->mTimeAccessor->mCount != 0)) {
    std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
    vector((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_> *)
           &it_3);
    local_820._M_current =
         (ChannelEntry *)
         std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
         ::begin((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                  *)((long)&nodeName.field_2 + 8));
    while( true ) {
      e_2 = (ChannelEntry *)
            std::
            vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
            end((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                 *)((long)&nodeName.field_2 + 8));
      bVar12 = __gnu_cxx::operator!=
                         (&local_820,
                          (__normal_iterator<Assimp::Collada::ChannelEntry_*,_std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>_>
                           *)&e_2);
      if (!bVar12) break;
      __x = __gnu_cxx::
            __normal_iterator<Assimp::Collada::ChannelEntry_*,_std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>_>
            ::operator*(&local_820);
      uVar35 = std::__cxx11::string::empty();
      if (((uVar35 & 1) == 0) &&
         (lVar29 = std::__cxx11::string::find((char *)&__x->mTargetId,0xb64795), lVar29 != -1)) {
        std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
        push_back((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                   *)&it_3,__x);
      }
      __gnu_cxx::
      __normal_iterator<Assimp::Collada::ChannelEntry_*,_std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>_>
      ::operator++(&local_820);
    }
    sVar34 = std::
             vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
             size((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                   *)&it_3);
    if (sVar34 != 0) {
      this_03 = (aiMeshMorphAnim *)operator_new(0x410);
      aiMeshMorphAnim::aiMeshMorphAnim(this_03);
      morphTimeValues.
      super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)this_03;
      aiString::Set((aiString *)this_03,(string *)local_d8);
      std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::vector
                ((vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_> *)
                 local_850);
      it_4._M_current._4_4_ = 0;
      local_860._M_current =
           (ChannelEntry *)
           std::
           vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
           begin((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                  *)&it_3);
      while( true ) {
        e_3 = (ChannelEntry *)
              std::
              vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
              ::end((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                     *)&it_3);
        bVar12 = __gnu_cxx::operator!=
                           (&local_860,
                            (__normal_iterator<Assimp::Collada::ChannelEntry_*,_std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>_>
                             *)&e_3);
        if (!bVar12) break;
        apos = (size_type)
               __gnu_cxx::
               __normal_iterator<Assimp::Collada::ChannelEntry_*,_std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>_>
               ::operator*(&local_860);
        bpos = std::__cxx11::string::find((char)apos + '\b',0x28);
        _key = std::__cxx11::string::find((char)apos + '\b',0x29);
        if ((bpos != 0xffffffffffffffff) && (_key != -1)) {
          for (valueIndex = 0; uVar35 = (ulong)valueIndex,
              sVar34 = std::vector<float,_std::allocator<float>_>::size
                                 ((vector<float,_std::allocator<float>_> *)
                                  (*(long *)(apos + 0x60) + 8)), uVar35 < sVar34;
              valueIndex = valueIndex + 1) {
            pvVar30 = std::vector<float,_std::allocator<float>_>::at
                                ((vector<float,_std::allocator<float>_> *)
                                 (*(long *)(apos + 0x60) + 8),(ulong)valueIndex);
            fVar44 = *pvVar30;
            pvVar30 = std::vector<float,_std::allocator<float>_>::at
                                ((vector<float,_std::allocator<float>_> *)
                                 (*(long *)(apos + 0x70) + 8),(ulong)valueIndex);
            insertMorphTimeValue
                      ((vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_> *)
                       local_850,fVar44,*pvVar30,it_4._M_current._4_4_);
          }
          it_4._M_current._4_4_ = it_4._M_current._4_4_ + 1;
        }
        __gnu_cxx::
        __normal_iterator<Assimp::Collada::ChannelEntry_*,_std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>_>
        ::operator++(&local_860);
      }
      sVar34 = std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::size
                         ((vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                           *)local_850);
      *(int *)&morphTimeValues.
               super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage[0x20].field_0x4 = (int)sVar34;
      uVar35 = (ulong)*(uint *)&morphTimeValues.
                                super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage[0x20].field_0x4;
      puVar31 = (ulong *)operator_new__(uVar35 << 5 | 8);
      *puVar31 = uVar35;
      paVar41 = (aiMeshMorphKey *)(puVar31 + 1);
      if (uVar35 != 0) {
        local_b20 = paVar41;
        do {
          aiMeshMorphKey::aiMeshMorphKey(local_b20);
          local_b20 = local_b20 + 1;
        } while (local_b20 != paVar41 + uVar35);
      }
      morphTimeValues.
      super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[0x20].mKeys.
      super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)paVar41;
      for (local_888 = 0;
          local_888 <
          *(uint *)&morphTimeValues.
                    super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage[0x20].field_0x4;
          local_888 = local_888 + 1) {
        sVar34 = std::
                 vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                 ::size((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                         *)&it_3);
        morphTimeValues.
        super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage[0x20].mKeys.
        super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
        ._M_impl.super__Vector_impl_data._M_start[(ulong)local_888 * 4 + 3].mWeight = (float)sVar34;
        sVar34 = std::
                 vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                 ::size((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                         *)&it_3);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = sVar34;
        uVar35 = SUB168(auVar6 * ZEXT816(4),0);
        if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
          uVar35 = 0xffffffffffffffff;
        }
        kVar32 = (key)operator_new__(uVar35);
        morphTimeValues.
        super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage[0x20].mKeys.
        super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
        ._M_impl.super__Vector_impl_data._M_start[(ulong)local_888 * 4 + 1] = kVar32;
        sVar34 = std::
                 vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                 ::size((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                         *)&it_3);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = sVar34;
        uVar35 = SUB168(auVar7 * ZEXT816(8),0);
        if (SUB168(auVar7 * ZEXT816(8),8) != 0) {
          uVar35 = 0xffffffffffffffff;
        }
        kVar32 = (key)operator_new__(uVar35);
        morphTimeValues.
        super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage[0x20].mKeys.
        super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
        ._M_impl.super__Vector_impl_data._M_start[(ulong)local_888 * 4 + 2] = kVar32;
        pvVar33 = std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::
                  operator[]((vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                              *)local_850,(ulong)local_888);
        morphTimeValues.
        super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage[0x20].mKeys.
        super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
        ._M_impl.super__Vector_impl_data._M_start[(ulong)local_888 * 4] =
             (key)(double)pvVar33->mTime;
        for (anim._4_4_ = 0; uVar35 = (ulong)anim._4_4_,
            sVar34 = std::
                     vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                     ::size((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                             *)&it_3), uVar35 < sVar34; anim._4_4_ = anim._4_4_ + 1) {
          *(uint *)((long)morphTimeValues.
                          super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage[0x20].mKeys.
                          super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
                          ._M_impl.super__Vector_impl_data._M_start[(ulong)local_888 * 4 + 1] +
                   (ulong)anim._4_4_ * 4) = anim._4_4_;
          fVar44 = getWeightAtKey((vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                                   *)local_850,local_888,anim._4_4_);
          *(double *)
           ((long)morphTimeValues.
                  super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage[0x20].mKeys.
                  super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
                  ._M_impl.super__Vector_impl_data._M_start[(ulong)local_888 * 4 + 2] +
           (ulong)anim._4_4_ * 8) = (double)fVar44;
        }
      }
      std::vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>::push_back
                ((vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_> *)&nit,
                 (value_type *)
                 &morphTimeValues.
                  super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::~vector
                ((vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_> *)
                 local_850);
    }
    std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
    ~vector((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_> *
            )&it_3);
  }
  std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::~vector
            ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)
             &transforms.
              super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_0063a618:
  std::__cxx11::string::~string((string *)&cit);
  std::__cxx11::string::~string((string *)(subElement.field_2._M_local_buf + 8));
LAB_0063a630:
  std::__cxx11::string::~string((string *)local_d8);
  std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
  ~vector((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_> *)
          ((long)&nodeName.field_2 + 8));
  __gnu_cxx::
  __normal_iterator<const_aiNode_*const_*,_std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>_>
  ::operator++(&local_90);
  goto LAB_0063823c;
}

Assistant:

void ColladaLoader::CreateAnimation(aiScene* pScene, const ColladaParser& pParser, const Collada::Animation* pSrcAnim, const std::string& pName)
{
    // collect a list of animatable nodes
    std::vector<const aiNode*> nodes;
    CollectNodes(pScene->mRootNode, nodes);

    std::vector<aiNodeAnim*> anims;
    std::vector<aiMeshMorphAnim*> morphAnims;

    for (std::vector<const aiNode*>::const_iterator nit = nodes.begin(); nit != nodes.end(); ++nit)
    {
        // find all the collada anim channels which refer to the current node
        std::vector<Collada::ChannelEntry> entries;
        std::string nodeName = (*nit)->mName.data;

        // find the collada node corresponding to the aiNode
        const Collada::Node* srcNode = FindNode(pParser.mRootNode, nodeName);
        //      ai_assert( srcNode != NULL);
        if (!srcNode)
            continue;

        // now check all channels if they affect the current node
        std::string targetID, subElement;
        for (std::vector<Collada::AnimationChannel>::const_iterator cit = pSrcAnim->mChannels.begin();
            cit != pSrcAnim->mChannels.end(); ++cit)
        {
            const Collada::AnimationChannel& srcChannel = *cit;
            Collada::ChannelEntry entry;

            // we expect the animation target to be of type "nodeName/transformID.subElement". Ignore all others
            // find the slash that separates the node name - there should be only one
            std::string::size_type slashPos = srcChannel.mTarget.find('/');
            if (slashPos == std::string::npos)
            {
                std::string::size_type targetPos = srcChannel.mTarget.find(srcNode->mID);
                if (targetPos == std::string::npos)
                    continue;

                // not node transform, but something else. store as unknown animation channel for now
                entry.mChannel = &(*cit);
                entry.mTargetId = srcChannel.mTarget.substr(targetPos + pSrcAnim->mName.length(),
                    srcChannel.mTarget.length() - targetPos - pSrcAnim->mName.length());
                if (entry.mTargetId.front() == '-')
                    entry.mTargetId = entry.mTargetId.substr(1);
                entries.push_back(entry);
                continue;
            }
            if (srcChannel.mTarget.find('/', slashPos + 1) != std::string::npos)
                continue;

            targetID.clear();
            targetID = srcChannel.mTarget.substr(0, slashPos);
            if (targetID != srcNode->mID)
                continue;

            // find the dot that separates the transformID - there should be only one or zero
            std::string::size_type dotPos = srcChannel.mTarget.find('.');
            if (dotPos != std::string::npos)
            {
                if (srcChannel.mTarget.find('.', dotPos + 1) != std::string::npos)
                    continue;

                entry.mTransformId = srcChannel.mTarget.substr(slashPos + 1, dotPos - slashPos - 1);

                subElement.clear();
                subElement = srcChannel.mTarget.substr(dotPos + 1);
                if (subElement == "ANGLE")
                    entry.mSubElement = 3; // last number in an Axis-Angle-Transform is the angle
                else if (subElement == "X")
                    entry.mSubElement = 0;
                else if (subElement == "Y")
                    entry.mSubElement = 1;
                else if (subElement == "Z")
                    entry.mSubElement = 2;
                else
                    ASSIMP_LOG_WARN_F("Unknown anim subelement <", subElement, ">. Ignoring");
            }
            else {
                // no subelement following, transformId is remaining string
                entry.mTransformId = srcChannel.mTarget.substr(slashPos + 1);
            }

            std::string::size_type bracketPos = srcChannel.mTarget.find('(');
            if (bracketPos != std::string::npos)
            {
                entry.mTransformId = srcChannel.mTarget.substr(slashPos + 1, bracketPos - slashPos - 1);
                subElement.clear();
                subElement = srcChannel.mTarget.substr(bracketPos);

                if (subElement == "(0)(0)")
                    entry.mSubElement = 0;
                else if (subElement == "(1)(0)")
                    entry.mSubElement = 1;
                else if (subElement == "(2)(0)")
                    entry.mSubElement = 2;
                else if (subElement == "(3)(0)")
                    entry.mSubElement = 3;
                else if (subElement == "(0)(1)")
                    entry.mSubElement = 4;
                else if (subElement == "(1)(1)")
                    entry.mSubElement = 5;
                else if (subElement == "(2)(1)")
                    entry.mSubElement = 6;
                else if (subElement == "(3)(1)")
                    entry.mSubElement = 7;
                else if (subElement == "(0)(2)")
                    entry.mSubElement = 8;
                else if (subElement == "(1)(2)")
                    entry.mSubElement = 9;
                else if (subElement == "(2)(2)")
                    entry.mSubElement = 10;
                else if (subElement == "(3)(2)")
                    entry.mSubElement = 11;
                else if (subElement == "(0)(3)")
                    entry.mSubElement = 12;
                else if (subElement == "(1)(3)")
                    entry.mSubElement = 13;
                else if (subElement == "(2)(3)")
                    entry.mSubElement = 14;
                else if (subElement == "(3)(3)")
                    entry.mSubElement = 15;
            }

            // determine which transform step is affected by this channel
            entry.mTransformIndex = SIZE_MAX;
            for (size_t a = 0; a < srcNode->mTransforms.size(); ++a)
                if (srcNode->mTransforms[a].mID == entry.mTransformId)
                    entry.mTransformIndex = a;

            if (entry.mTransformIndex == SIZE_MAX)
            {
                if (entry.mTransformId.find("morph-weights") != std::string::npos)
                {
                    entry.mTargetId = entry.mTransformId;
                    entry.mTransformId = "";
                }
                else
                    continue;
            }

            entry.mChannel = &(*cit);
            entries.push_back(entry);
        }

        // if there's no channel affecting the current node, we skip it
        if (entries.empty())
            continue;

        // resolve the data pointers for all anim channels. Find the minimum time while we're at it
        ai_real startTime = ai_real(1e20), endTime = ai_real(-1e20);
        for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
        {
            Collada::ChannelEntry& e = *it;
            e.mTimeAccessor = &pParser.ResolveLibraryReference(pParser.mAccessorLibrary, e.mChannel->mSourceTimes);
            e.mTimeData = &pParser.ResolveLibraryReference(pParser.mDataLibrary, e.mTimeAccessor->mSource);
            e.mValueAccessor = &pParser.ResolveLibraryReference(pParser.mAccessorLibrary, e.mChannel->mSourceValues);
            e.mValueData = &pParser.ResolveLibraryReference(pParser.mDataLibrary, e.mValueAccessor->mSource);

            // time count and value count must match
            if (e.mTimeAccessor->mCount != e.mValueAccessor->mCount)
                throw DeadlyImportError(format() << "Time count / value count mismatch in animation channel \"" << e.mChannel->mTarget << "\".");

            if (e.mTimeAccessor->mCount > 0)
            {
                // find bounding times
                startTime = std::min(startTime, ReadFloat(*e.mTimeAccessor, *e.mTimeData, 0, 0));
                endTime = std::max(endTime, ReadFloat(*e.mTimeAccessor, *e.mTimeData, e.mTimeAccessor->mCount - 1, 0));
            }
        }

        std::vector<aiMatrix4x4> resultTrafos;
        if (!entries.empty() && entries.front().mTimeAccessor->mCount > 0)
        {
            // create a local transformation chain of the node's transforms
            std::vector<Collada::Transform> transforms = srcNode->mTransforms;

            // now for every unique point in time, find or interpolate the key values for that time
            // and apply them to the transform chain. Then the node's present transformation can be calculated.
            ai_real time = startTime;
            while (1)
            {
                for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
                {
                    Collada::ChannelEntry& e = *it;

                    // find the keyframe behind the current point in time
                    size_t pos = 0;
                    ai_real postTime = 0.0;
                    while (1)
                    {
                        if (pos >= e.mTimeAccessor->mCount)
                            break;
                        postTime = ReadFloat(*e.mTimeAccessor, *e.mTimeData, pos, 0);
                        if (postTime >= time)
                            break;
                        ++pos;
                    }

                    pos = std::min(pos, e.mTimeAccessor->mCount - 1);

                    // read values from there
                    ai_real temp[16];
                    for (size_t c = 0; c < e.mValueAccessor->mSize; ++c)
                        temp[c] = ReadFloat(*e.mValueAccessor, *e.mValueData, pos, c);

                    // if not exactly at the key time, interpolate with previous value set
                    if (postTime > time && pos > 0)
                    {
                        ai_real preTime = ReadFloat(*e.mTimeAccessor, *e.mTimeData, pos - 1, 0);
                        ai_real factor = (time - postTime) / (preTime - postTime);

                        for (size_t c = 0; c < e.mValueAccessor->mSize; ++c)
                        {
                            ai_real v = ReadFloat(*e.mValueAccessor, *e.mValueData, pos - 1, c);
                            temp[c] += (v - temp[c]) * factor;
                        }
                    }

                    // Apply values to current transformation
                    std::copy(temp, temp + e.mValueAccessor->mSize, transforms[e.mTransformIndex].f + e.mSubElement);
                }

                // Calculate resulting transformation
                aiMatrix4x4 mat = pParser.CalculateResultTransform(transforms);

                // out of laziness: we store the time in matrix.d4
                mat.d4 = time;
                resultTrafos.push_back(mat);

                // find next point in time to evaluate. That's the closest frame larger than the current in any channel
                ai_real nextTime = ai_real(1e20);
                for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
                {
                    Collada::ChannelEntry& channelElement = *it;

                    // find the next time value larger than the current
                    size_t pos = 0;
                    while (pos < channelElement.mTimeAccessor->mCount)
                    {
                        const ai_real t = ReadFloat(*channelElement.mTimeAccessor, *channelElement.mTimeData, pos, 0);
                        if (t > time)
                        {
                            nextTime = std::min(nextTime, t);
                            break;
                        }
                        ++pos;
                    }

                    // https://github.com/assimp/assimp/issues/458
                    // Sub-sample axis-angle channels if the delta between two consecutive
                    // key-frame angles is >= 180 degrees.
                    if (transforms[channelElement.mTransformIndex].mType == Collada::TF_ROTATE && channelElement.mSubElement == 3 && pos > 0 && pos < channelElement.mTimeAccessor->mCount) {
                        const ai_real cur_key_angle = ReadFloat(*channelElement.mValueAccessor, *channelElement.mValueData, pos, 0);
                        const ai_real last_key_angle = ReadFloat(*channelElement.mValueAccessor, *channelElement.mValueData, pos - 1, 0);
                        const ai_real cur_key_time = ReadFloat(*channelElement.mTimeAccessor, *channelElement.mTimeData, pos, 0);
                        const ai_real last_key_time = ReadFloat(*channelElement.mTimeAccessor, *channelElement.mTimeData, pos - 1, 0);
                        const ai_real last_eval_angle = last_key_angle + (cur_key_angle - last_key_angle) * (time - last_key_time) / (cur_key_time - last_key_time);
                        const ai_real delta = std::abs(cur_key_angle - last_eval_angle);
                        if (delta >= 180.0) {
                            const int subSampleCount = static_cast<int>(std::floor(delta / 90.0));
                            if (cur_key_time != time) {
                                const ai_real nextSampleTime = time + (cur_key_time - time) / subSampleCount;
                                nextTime = std::min(nextTime, nextSampleTime);
                            }
                        }
                    }
                }

                // no more keys on any channel after the current time -> we're done
                if (nextTime > 1e19)
                    break;

                // else construct next keyframe at this following time point
                time = nextTime;
            }
        }

        // there should be some keyframes, but we aren't that fixated on valid input data
//      ai_assert( resultTrafos.size() > 0);

        // build an animation channel for the given node out of these trafo keys
        if (!resultTrafos.empty())
        {
            aiNodeAnim* dstAnim = new aiNodeAnim;
            dstAnim->mNodeName = nodeName;
            dstAnim->mNumPositionKeys = static_cast<unsigned int>(resultTrafos.size());
            dstAnim->mNumRotationKeys = static_cast<unsigned int>(resultTrafos.size());
            dstAnim->mNumScalingKeys = static_cast<unsigned int>(resultTrafos.size());
            dstAnim->mPositionKeys = new aiVectorKey[resultTrafos.size()];
            dstAnim->mRotationKeys = new aiQuatKey[resultTrafos.size()];
            dstAnim->mScalingKeys = new aiVectorKey[resultTrafos.size()];

            for (size_t a = 0; a < resultTrafos.size(); ++a)
            {
                aiMatrix4x4 mat = resultTrafos[a];
                double time = double(mat.d4); // remember? time is stored in mat.d4
                mat.d4 = 1.0f;

                dstAnim->mPositionKeys[a].mTime = time;
                dstAnim->mRotationKeys[a].mTime = time;
                dstAnim->mScalingKeys[a].mTime = time;
                mat.Decompose(dstAnim->mScalingKeys[a].mValue, dstAnim->mRotationKeys[a].mValue, dstAnim->mPositionKeys[a].mValue);
            }

            anims.push_back(dstAnim);
        }
        else
        {
            ASSIMP_LOG_WARN("Collada loader: found empty animation channel, ignored. Please check your exporter.");
        }

        if (!entries.empty() && entries.front().mTimeAccessor->mCount > 0)
        {
            std::vector<Collada::ChannelEntry> morphChannels;
            for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
            {
                Collada::ChannelEntry& e = *it;

                // skip non-transform types
                if (e.mTargetId.empty())
                    continue;

                if (e.mTargetId.find("morph-weights") != std::string::npos)
                    morphChannels.push_back(e);
            }
            if (morphChannels.size() > 0)
            {
                // either 1) morph weight animation count should contain morph target count channels
                // or     2) one channel with morph target count arrays
                // assume first

                aiMeshMorphAnim *morphAnim = new aiMeshMorphAnim;
                morphAnim->mName.Set(nodeName);

                std::vector<MorphTimeValues> morphTimeValues;

                int morphAnimChannelIndex = 0;
                for (std::vector<Collada::ChannelEntry>::iterator it = morphChannels.begin(); it != morphChannels.end(); ++it)
                {
                    Collada::ChannelEntry& e = *it;
                    std::string::size_type apos = e.mTargetId.find('(');
                    std::string::size_type bpos = e.mTargetId.find(')');
                    if (apos == std::string::npos || bpos == std::string::npos)
                        // unknown way to specify weight -> ignore this animation
                        continue;

                    // weight target can be in format Weight_M_N, Weight_N, WeightN, or some other way
                    // we ignore the name and just assume the channels are in the right order
                    for (unsigned int i = 0; i < e.mTimeData->mValues.size(); i++)
                        insertMorphTimeValue(morphTimeValues, e.mTimeData->mValues.at(i), e.mValueData->mValues.at(i), morphAnimChannelIndex);

                    ++morphAnimChannelIndex;
                }

                morphAnim->mNumKeys = static_cast<unsigned int>(morphTimeValues.size());
                morphAnim->mKeys = new aiMeshMorphKey[morphAnim->mNumKeys];
                for (unsigned int key = 0; key < morphAnim->mNumKeys; key++)
                {
                    morphAnim->mKeys[key].mNumValuesAndWeights = static_cast<unsigned int>(morphChannels.size());
                    morphAnim->mKeys[key].mValues = new unsigned int[morphChannels.size()];
                    morphAnim->mKeys[key].mWeights = new double[morphChannels.size()];

                    morphAnim->mKeys[key].mTime = morphTimeValues[key].mTime;
                    for (unsigned int valueIndex = 0; valueIndex < morphChannels.size(); valueIndex++)
                    {
                        morphAnim->mKeys[key].mValues[valueIndex] = valueIndex;
                        morphAnim->mKeys[key].mWeights[valueIndex] = getWeightAtKey(morphTimeValues, key, valueIndex);
                    }
                }

                morphAnims.push_back(morphAnim);
            }
        }
    }

    if (!anims.empty() || !morphAnims.empty())
    {
        aiAnimation* anim = new aiAnimation;
        anim->mName.Set(pName);
        anim->mNumChannels = static_cast<unsigned int>(anims.size());
        if (anim->mNumChannels > 0)
        {
            anim->mChannels = new aiNodeAnim*[anims.size()];
            std::copy(anims.begin(), anims.end(), anim->mChannels);
        }
        anim->mNumMorphMeshChannels = static_cast<unsigned int>(morphAnims.size());
        if (anim->mNumMorphMeshChannels > 0)
        {
            anim->mMorphMeshChannels = new aiMeshMorphAnim*[anim->mNumMorphMeshChannels];
            std::copy(morphAnims.begin(), morphAnims.end(), anim->mMorphMeshChannels);
        }
        anim->mDuration = 0.0f;
        for (size_t a = 0; a < anims.size(); ++a)
        {
            anim->mDuration = std::max(anim->mDuration, anims[a]->mPositionKeys[anims[a]->mNumPositionKeys - 1].mTime);
            anim->mDuration = std::max(anim->mDuration, anims[a]->mRotationKeys[anims[a]->mNumRotationKeys - 1].mTime);
            anim->mDuration = std::max(anim->mDuration, anims[a]->mScalingKeys[anims[a]->mNumScalingKeys - 1].mTime);
        }
        for (size_t a = 0; a < morphAnims.size(); ++a)
        {
            anim->mDuration = std::max(anim->mDuration, morphAnims[a]->mKeys[morphAnims[a]->mNumKeys - 1].mTime);
        }
        anim->mTicksPerSecond = 1;
        mAnims.push_back(anim);
    }
}